

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cortex.cpp
# Opt level: O1

int Cortex_CopyFrame(sFrameOfData *pSrc,sFrameOfData *pDst)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  tMarkerData *pafVar5;
  short *psVar6;
  tForceData *pafVar7;
  double *pdVar8;
  long lVar9;
  
  iVar3 = pSrc->nBodies;
  pDst->iFrame = pSrc->iFrame;
  pDst->nBodies = iVar3;
  if (0 < (long)iVar3) {
    lVar9 = 0;
    do {
      iVar1 = *(int *)(pSrc->BodyData[0].szName + lVar9 + 0x80);
      iVar2 = iVar1 * 0xc;
      if (*(int *)(pDst->BodyData[0].szName + lVar9 + 0x80) != iVar1) {
        pvVar4 = realloc(*(void **)((long)&pDst->BodyData[0].Markers + lVar9),(long)iVar2);
        if (pvVar4 == (void *)0x0 && 0 < iVar2) goto LAB_00105b6d;
        *(int *)(pDst->BodyData[0].szName + lVar9 + 0x80) = iVar1;
        *(void **)((long)&pDst->BodyData[0].Markers + lVar9) = pvVar4;
      }
      memcpy(*(void **)((long)&pDst->BodyData[0].Markers + lVar9),
             *(void **)((long)&pSrc->BodyData[0].Markers + lVar9),(long)iVar2);
      iVar1 = *(int *)((long)&pSrc->BodyData[0].nSegments + lVar9);
      iVar2 = iVar1 * 0x38;
      if (*(int *)((long)&pDst->BodyData[0].nSegments + lVar9) != iVar1) {
        pvVar4 = realloc(*(void **)((long)&pDst->BodyData[0].Segments + lVar9),(long)iVar2);
        if (pvVar4 == (void *)0x0 && 0 < iVar2) goto LAB_00105b6d;
        *(int *)((long)&pDst->BodyData[0].nSegments + lVar9) = iVar1;
        *(void **)((long)&pDst->BodyData[0].Segments + lVar9) = pvVar4;
      }
      memcpy(*(void **)((long)&pDst->BodyData[0].Segments + lVar9),
             *(void **)((long)&pSrc->BodyData[0].Segments + lVar9),(long)iVar2);
      iVar2 = *(int *)((long)&pSrc->BodyData[0].nDofs + lVar9);
      iVar1 = iVar2 * 8;
      if (*(int *)((long)&pDst->BodyData[0].nDofs + lVar9) != iVar2) {
        pvVar4 = realloc(*(void **)((long)&pDst->BodyData[0].Dofs + lVar9),(long)iVar1);
        if (pvVar4 == (void *)0x0 && 0 < iVar1) goto LAB_00105b6d;
        *(int *)((long)&pDst->BodyData[0].nDofs + lVar9) = iVar2;
        *(void **)((long)&pDst->BodyData[0].Dofs + lVar9) = pvVar4;
      }
      memcpy(*(void **)((long)&pDst->BodyData[0].Dofs + lVar9),
             *(void **)((long)&pSrc->BodyData[0].Dofs + lVar9),(long)iVar1);
      *(undefined4 *)((long)&pDst->BodyData[0].fAvgDofResidual + lVar9) =
           *(undefined4 *)((long)&pSrc->BodyData[0].fAvgDofResidual + lVar9);
      *(undefined8 *)((long)&pDst->BodyData[0].nIterations + lVar9) =
           *(undefined8 *)((long)&pSrc->BodyData[0].nIterations + lVar9);
      *(undefined4 *)((long)&pDst->BodyData[0].FocusEncoderValue + lVar9) =
           *(undefined4 *)((long)&pSrc->BodyData[0].FocusEncoderValue + lVar9);
      lVar9 = lVar9 + 0xc0;
    } while ((long)iVar3 * 0xc0 != lVar9);
  }
  iVar3 = pSrc->nUnidentifiedMarkers;
  iVar1 = iVar3 * 0xc;
  if (pDst->nUnidentifiedMarkers == iVar3) {
LAB_00105a1d:
    memcpy(pDst->UnidentifiedMarkers,pSrc->UnidentifiedMarkers,(long)iVar1);
    iVar3 = (pSrc->AnalogData).nAnalogChannels;
    iVar1 = (pSrc->AnalogData).nAnalogSamples;
    iVar2 = iVar3 * iVar1 * 2;
    if (((pDst->AnalogData).nAnalogChannels != iVar3) ||
       ((pDst->AnalogData).nAnalogSamples != iVar1)) {
      psVar6 = (short *)realloc((pDst->AnalogData).AnalogSamples,(long)iVar2);
      if (psVar6 == (short *)0x0 && 0 < iVar2) goto LAB_00105b6d;
      (pDst->AnalogData).nAnalogChannels = iVar3;
      (pDst->AnalogData).nAnalogSamples = iVar1;
      (pDst->AnalogData).AnalogSamples = psVar6;
    }
    memcpy((pDst->AnalogData).AnalogSamples,(pSrc->AnalogData).AnalogSamples,(long)iVar2);
    iVar3 = (pSrc->AnalogData).nForcePlates;
    iVar1 = (pSrc->AnalogData).nForceSamples;
    iVar2 = iVar3 * iVar1 * 0x1c;
    if (((pDst->AnalogData).nForcePlates != iVar3) || ((pDst->AnalogData).nForceSamples != iVar1)) {
      pafVar7 = (tForceData *)realloc((pDst->AnalogData).Forces,(long)iVar2);
      if (pafVar7 == (tForceData *)0x0 && 0 < iVar2) goto LAB_00105b6d;
      (pDst->AnalogData).nForcePlates = iVar3;
      (pDst->AnalogData).nForceSamples = iVar1;
      (pDst->AnalogData).Forces = pafVar7;
    }
    memcpy((pDst->AnalogData).Forces,(pSrc->AnalogData).Forces,(long)iVar2);
    iVar3 = (pSrc->AnalogData).nAngleEncoders;
    iVar1 = (pSrc->AnalogData).nAngleEncoderSamples;
    iVar2 = iVar3 * iVar1 * 8;
    if (((pDst->AnalogData).nAngleEncoders != iVar3) ||
       ((pDst->AnalogData).nAngleEncoderSamples != iVar1)) {
      pdVar8 = (double *)realloc((pDst->AnalogData).AngleEncoderSamples,(long)iVar2);
      if (pdVar8 == (double *)0x0 && 0 < iVar2) goto LAB_00105b6d;
      (pDst->AnalogData).nAngleEncoders = iVar3;
      (pDst->AnalogData).nAngleEncoderSamples = iVar1;
      (pDst->AnalogData).AngleEncoderSamples = pdVar8;
    }
    memcpy((pDst->AnalogData).AngleEncoderSamples,(pSrc->AnalogData).AngleEncoderSamples,(long)iVar2
          );
    iVar3 = 0;
  }
  else {
    pafVar5 = (tMarkerData *)realloc(pDst->UnidentifiedMarkers,(long)iVar1);
    if (pafVar5 != (tMarkerData *)0x0 || iVar1 < 1) {
      pDst->nUnidentifiedMarkers = iVar3;
      pDst->UnidentifiedMarkers = pafVar5;
      goto LAB_00105a1d;
    }
LAB_00105b6d:
    Cortex_FreeFrame(pDst);
    iVar3 = 5;
  }
  return iVar3;
}

Assistant:

int Cortex_CopyFrame(const sFrameOfData* pSrc, sFrameOfData* pDst)
{
  int iBody;
  int nBodies = pSrc->nBodies;
  const sBodyData* SrcBody;
  sBodyData* DstBody;

  int n;
  void *ptr;
  int size;

  pDst->iFrame = pSrc->iFrame;

  pDst->nBodies = nBodies;

  for (iBody = 0; iBody < nBodies; iBody++) {
    SrcBody = &pSrc->BodyData[iBody];
    DstBody = &pDst->BodyData[iBody];

    // Copy Markers

    n = SrcBody->nMarkers;
    size = n * sizeof(tMarkerData);

    if (DstBody->nMarkers != n) {
      ptr = realloc(DstBody->Markers, size);
      if (size > 0 && ptr == NULL) {
        Cortex_FreeFrame(pDst);
        return RC_MemoryError;
      }
      DstBody->nMarkers = n;
      DstBody->Markers = (tMarkerData*) ptr;
    }

    memcpy(DstBody->Markers, SrcBody->Markers, size);

    // Copy Segments

    n = SrcBody->nSegments;
    size = n * sizeof(tSegmentData);

    if (DstBody->nSegments != n) {
      ptr = realloc(DstBody->Segments, size);
      if (size > 0 && ptr == NULL) {
        Cortex_FreeFrame(pDst);
        return RC_MemoryError;
      }
      DstBody->nSegments = n;
      DstBody->Segments = (tSegmentData*) ptr;
    }

    memcpy(DstBody->Segments, SrcBody->Segments, size);

    // Copy DOFs

    n = SrcBody->nDofs;
    size = n * sizeof(tDofData);

    if (DstBody->nDofs != n) {
      ptr = realloc(DstBody->Dofs, size);
      if (size > 0 && ptr == NULL) {
        Cortex_FreeFrame(pDst);
        return RC_MemoryError;
      }
      DstBody->nDofs = n;
      DstBody->Dofs = (tDofData*) ptr;
    }

    memcpy(DstBody->Dofs, SrcBody->Dofs, size);

    // Copy extra items
    DstBody->fAvgDofResidual = SrcBody->fAvgDofResidual;
    DstBody->nIterations = SrcBody->nIterations;
    DstBody->ZoomEncoderValue = SrcBody->ZoomEncoderValue;
    DstBody->FocusEncoderValue = SrcBody->FocusEncoderValue;
  }

  // Copy Unidentified Markers

  n = pSrc->nUnidentifiedMarkers;
  size = n * sizeof(tMarkerData);

  if (pDst->nUnidentifiedMarkers != n) {
    ptr = realloc(pDst->UnidentifiedMarkers, size);
    if (size > 0 && ptr == NULL) {
      Cortex_FreeFrame(pDst);
      return RC_MemoryError;
    }
    pDst->nUnidentifiedMarkers = n;
    pDst->UnidentifiedMarkers = (tMarkerData*) ptr;
  }

  memcpy(pDst->UnidentifiedMarkers, pSrc->UnidentifiedMarkers, size);

  // Copy Analog

  const sAnalogData* SrcAnalog = &pSrc->AnalogData;
  sAnalogData* DstAnalog = &pDst->AnalogData;

  // Analog Channels

  int nChannels = SrcAnalog->nAnalogChannels;
  int nSamples = SrcAnalog->nAnalogSamples;

  size = nChannels * nSamples * sizeof(short);

  if (DstAnalog->nAnalogChannels != nChannels || DstAnalog->nAnalogSamples
      != nSamples) {
    ptr = realloc(DstAnalog->AnalogSamples, size);
    if (size > 0 && ptr == NULL) {
      Cortex_FreeFrame(pDst);
      return RC_MemoryError;
    }
    DstAnalog->nAnalogChannels = nChannels;
    DstAnalog->nAnalogSamples = nSamples;
    DstAnalog->AnalogSamples = (short*) ptr;
  }

  memcpy(DstAnalog->AnalogSamples, SrcAnalog->AnalogSamples, size);

  // Forces Data

  int nForcePlates = SrcAnalog->nForcePlates;
  int nForceSamples = SrcAnalog->nForceSamples;

  size = nForcePlates * nForceSamples * sizeof(tForceData);

  if (DstAnalog->nForcePlates != nForcePlates || DstAnalog->nForceSamples
      != nForceSamples) {
    ptr = realloc(DstAnalog->Forces, size);
    if (size > 0 && ptr == NULL) {
      Cortex_FreeFrame(pDst);
      return RC_MemoryError;
    }
    DstAnalog->nForcePlates = nForcePlates;
    DstAnalog->nForceSamples = nForceSamples;
    DstAnalog->Forces = (tForceData*) ptr;
  }

  memcpy(DstAnalog->Forces, SrcAnalog->Forces, size);

  int nAngleEncoders = SrcAnalog->nAngleEncoders;
  int nAngleEncoderSamples = SrcAnalog->nAngleEncoderSamples;

  size = nAngleEncoders * nAngleEncoderSamples * sizeof(double);

  if (DstAnalog->nAngleEncoders != nAngleEncoders
      || DstAnalog->nAngleEncoderSamples != nAngleEncoderSamples) {
    ptr = realloc(DstAnalog->AngleEncoderSamples, size);
    if (size > 0 && ptr == NULL) {
      Cortex_FreeFrame(pDst);
      return RC_MemoryError;
    }
    DstAnalog->nAngleEncoders = nAngleEncoders;
    DstAnalog->nAngleEncoderSamples = nAngleEncoderSamples;
    DstAnalog->AngleEncoderSamples = (double*) ptr;
  }

  memcpy(DstAnalog->AngleEncoderSamples, SrcAnalog->AngleEncoderSamples, size);

  return RC_Okay;
}